

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

float get_adaptive_thresholds
                (TX_SIZE tx_size,TxSetType tx_set_type,TX_TYPE_PRUNE_MODE prune_2d_txfm_mode)

{
  byte in_DL;
  char in_SIL;
  byte in_DIL;
  int pruning_aggressiveness;
  int prune_aggr_table [5] [2];
  int local_3c;
  int local_38 [13];
  byte local_3;
  char local_2;
  byte local_1;
  
  local_3 = in_DL;
  local_2 = in_SIL;
  local_1 = in_DIL;
  memcpy(local_38,&DAT_00bc4190,0x28);
  local_3c = 0;
  if (local_2 == '\x05') {
    local_3c = local_38[(long)(int)(local_3 - 1) * 2];
  }
  else if (local_2 == '\x04') {
    local_3c = local_38[(long)(int)(local_3 - 1) * 2 + 1];
  }
  return prune_2D_adaptive_thresholds[local_1][local_3c];
}

Assistant:

static inline float get_adaptive_thresholds(
    TX_SIZE tx_size, TxSetType tx_set_type,
    TX_TYPE_PRUNE_MODE prune_2d_txfm_mode) {
  const int prune_aggr_table[5][2] = {
    { 4, 1 }, { 6, 3 }, { 9, 6 }, { 9, 6 }, { 12, 9 }
  };
  int pruning_aggressiveness = 0;
  if (tx_set_type == EXT_TX_SET_ALL16)
    pruning_aggressiveness =
        prune_aggr_table[prune_2d_txfm_mode - TX_TYPE_PRUNE_1][0];
  else if (tx_set_type == EXT_TX_SET_DTT9_IDTX_1DDCT)
    pruning_aggressiveness =
        prune_aggr_table[prune_2d_txfm_mode - TX_TYPE_PRUNE_1][1];

  return prune_2D_adaptive_thresholds[tx_size][pruning_aggressiveness];
}